

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_new_string8(JSContext *ctx,uint8_t *buf,int len)

{
  ulong in_RAX;
  JSRefCountHeader *p;
  int64_t iVar1;
  JSValue JVar2;
  JSValueUnion local_28;
  
  if (len < 1) {
    local_28 = (JSValueUnion)((JSValueUnion *)(ctx->rt->atom_array + 0x2f))->ptr;
    *(int *)local_28.ptr = *local_28.ptr + 1;
  }
  else {
    local_28.ptr = js_alloc_string(ctx,len,0);
    if ((JSString *)local_28.ptr == (JSString *)0x0) {
      local_28.ptr = (void *)(in_RAX & 0xffffffff00000000);
      iVar1 = 6;
      goto LAB_0011ba00;
    }
    memcpy((JSString *)((long)local_28.ptr + 0x10),buf,(ulong)(uint)len);
    *(undefined1 *)((long)local_28.ptr + (ulong)(uint)len + 0x10) = 0;
  }
  iVar1 = -7;
LAB_0011ba00:
  JVar2.tag = iVar1;
  JVar2.u.ptr = local_28.ptr;
  return JVar2;
}

Assistant:

static JSValue js_new_string8(JSContext *ctx, const uint8_t *buf, int len)
{
    JSString *str;

    if (len <= 0) {
        return JS_AtomToString(ctx, JS_ATOM_empty_string);
    }
    str = js_alloc_string(ctx, len, 0);
    if (!str)
        return JS_EXCEPTION;
    memcpy(str->u.str8, buf, len);
    str->u.str8[len] = '\0';
    return JS_MKPTR(JS_TAG_STRING, str);
}